

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * evaluate_conditional_expression(dmr_C *C,expression *expr)

{
  ctype *pcVar1;
  int iVar2;
  symbol *psVar3;
  symbol *psVar4;
  symbol *psVar5;
  expression *peVar6;
  symbol *psVar7;
  char *pcVar8;
  symbol *psVar9;
  char cVar10;
  ulong uVar11;
  symbol *psVar12;
  char cVar13;
  uint lclass;
  ulong uVar14;
  anon_union_32_18_55d8ca1e_for_expression_5 *paVar15;
  uint rclass;
  
  psVar3 = evaluate_conditional(C,(expr->field_5).field_3.unop,0);
  if (psVar3 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  psVar3 = dmrC_evaluate_expression(C,(expr->field_5).field_10.cond_false);
  if (psVar3 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  psVar4 = degenerate(C,(expr->field_5).field_3.unop);
  psVar3 = degenerate(C,(expr->field_5).field_10.cond_false);
  peVar6 = (expr->field_5).field_6.right;
  if (peVar6 == (expression *)0x0) {
    paVar15 = &expr->field_5;
    psVar5 = psVar4;
  }
  else {
    psVar5 = dmrC_evaluate_expression(C,peVar6);
    if (psVar5 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    paVar15 = (anon_union_32_18_55d8ca1e_for_expression_5 *)((long)&expr->field_5 + 8);
    psVar5 = degenerate(C,(paVar15->field_3).unop);
  }
  if ((0xff < *(ushort *)expr) &&
     (((*(ushort *)(expr->field_5).field_3.unop & *(ushort *)(paVar15->field_3).unop &
       *(ushort *)(expr->field_5).field_10.cond_false) >> 8 & 1) == 0)) {
    *(ushort *)expr = *(ushort *)expr & 0xff;
  }
  if (*(char *)psVar5 == '\x03') {
    psVar5 = *(symbol **)((long)&psVar5->field_14 + 0x38);
  }
  if (*(char *)psVar5 == '\v') {
    psVar5 = dmrC_evaluate_expression(C,(psVar5->field_14).field_2.initializer);
    if (psVar5 == (symbol *)0x0) {
      psVar5 = &C->S->bad_ctype;
    }
    else if (*(char *)psVar5 == '\x03') {
      psVar5 = *(symbol **)((long)&psVar5->field_14 + 0x38);
    }
  }
  if (*(char *)psVar5 == '\t') {
    psVar5 = *(symbol **)((long)&psVar5->field_14 + 0x38);
  }
  if ((ulong)*(byte *)psVar5 == 2) {
    psVar9 = (psVar5->field_14).field_2.ctype.base_type;
    if (psVar9 == &C->S->int_type) {
      lclass = 1;
    }
    else {
      if (psVar9 != &C->S->fp_type) goto LAB_0010d7c2;
      lclass = 9;
    }
  }
  else {
LAB_0010d7c2:
    lclass = classify_type::type_class[*(byte *)psVar5];
  }
  if (*(char *)psVar3 == '\x03') {
    psVar3 = *(symbol **)((long)&psVar3->field_14 + 0x38);
  }
  if (*(char *)psVar3 == '\v') {
    psVar3 = dmrC_evaluate_expression(C,(psVar3->field_14).field_2.initializer);
    if (psVar3 == (symbol *)0x0) {
      psVar3 = &C->S->bad_ctype;
    }
    else if (*(char *)psVar3 == '\x03') {
      psVar3 = *(symbol **)((long)&psVar3->field_14 + 0x38);
    }
  }
  if (*(char *)psVar3 == '\t') {
    psVar3 = *(symbol **)((long)&psVar3->field_14 + 0x38);
  }
  if ((ulong)*(byte *)psVar3 == 2) {
    psVar9 = (psVar3->field_14).field_2.ctype.base_type;
    if (psVar9 == &C->S->int_type) {
      rclass = 1;
    }
    else {
      if (psVar9 != &C->S->fp_type) goto LAB_0010d86c;
      rclass = 9;
    }
  }
  else {
LAB_0010d86c:
    rclass = classify_type::type_class[*(byte *)psVar3];
  }
  if ((rclass & lclass & 1) == 0) {
    if (((rclass | lclass) & 0x10) == 0) {
      psVar4 = psVar5;
      psVar9 = psVar5;
      if (psVar5 == psVar3) goto LAB_0010d907;
    }
    else {
      peVar6 = (paVar15->field_3).unop;
      cVar13 = '\x01';
      if ((peVar6->ctype != &C->S->null_ctype) && (cVar13 = '\0', (peVar6->field_0x1 & 1) != 0)) {
        iVar2 = dmrC_is_zero_constant(C,peVar6);
        cVar13 = (iVar2 != 0) * '\x02';
      }
      cVar10 = '\x01';
      peVar6 = (expr->field_5).field_10.cond_false;
      if ((peVar6->ctype != &C->S->null_ctype) && (cVar10 = '\0', (peVar6->field_0x1 & 1) != 0)) {
        iVar2 = dmrC_is_zero_constant(C,peVar6);
        cVar10 = (iVar2 != 0) * '\x02';
      }
      if ((cVar13 == '\0') || (cVar10 == '\0')) {
        if (((rclass & 0x10) == 0) || (cVar13 == '\0')) {
          if ((cVar10 == '\0') || ((lclass & 0x10) == 0)) {
            cVar13 = '\x03';
            if (((rclass & lclass & 0x10) == 0) ||
               (*(int *)((long)&psVar5->field_14 + 0x30) != *(int *)((long)&psVar3->field_14 + 0x30)
               )) {
              uVar14 = 0;
            }
            else {
              psVar9 = dmrC_examine_pointer_target(C->S,psVar5);
              psVar7 = dmrC_examine_pointer_target(C->S,psVar3);
              psVar4 = (psVar5->field_14).field_2.ctype.base_type;
              uVar11 = (ulong)((uint)(psVar5->field_14).field_2.ctype.modifiers & 0x2030);
              if ((psVar4 != (symbol *)0x0) && (*(char *)psVar4 == '\x06')) {
                uVar11 = 0;
              }
              psVar4 = (psVar3->field_14).field_2.ctype.base_type;
              uVar14 = (ulong)((uint)(psVar3->field_14).field_2.ctype.modifiers & 0x2030);
              if ((psVar4 != (symbol *)0x0) && (*(char *)psVar4 == '\x06')) {
                uVar14 = 0;
              }
              uVar14 = uVar14 | uVar11;
              psVar12 = &C->S->void_ctype;
              cVar13 = '\x04';
              psVar4 = psVar5;
              if ((psVar9 != psVar12) && (psVar4 = psVar3, psVar7 != psVar12)) {
                pcVar8 = dmrC_type_difference
                                   (C,&(psVar5->field_14).field_2.ctype,
                                    &(psVar3->field_14).field_2.ctype,uVar14,uVar14);
                cVar13 = (pcVar8 == (char *)0x0) + '\x03';
                psVar4 = psVar5;
              }
            }
          }
          else {
            if ((cVar10 == '\x02') && (C->Wnon_pointer_null != 0)) {
              dmrC_warning(C,((expr->field_5).field_10.cond_false)->pos,
                           "Using plain integer as NULL pointer");
            }
            peVar6 = cast_to(C,(expr->field_5).field_10.cond_false,psVar5);
            (expr->field_5).field_10.cond_false = peVar6;
            cVar13 = '\x02';
            uVar14 = 0;
            psVar4 = psVar5;
          }
        }
        else {
          if ((cVar13 == '\x02') && (C->Wnon_pointer_null != 0)) {
            dmrC_warning(C,((paVar15->field_3).unop)->pos,"Using plain integer as NULL pointer");
          }
          peVar6 = cast_to(C,(paVar15->field_3).unop,psVar3);
          (paVar15->field_3).unop = peVar6;
          cVar13 = '\x02';
          uVar14 = 0;
          psVar4 = psVar3;
        }
      }
      else {
        peVar6 = cast_to(C,(paVar15->field_3).unop,&C->S->ptr_ctype);
        (paVar15->field_3).unop = peVar6;
        peVar6 = cast_to(C,(expr->field_5).field_10.cond_false,&C->S->ptr_ctype);
        (expr->field_5).field_10.cond_false = peVar6;
        cVar13 = '\x02';
        uVar14 = 0;
        psVar4 = &C->S->ptr_ctype;
      }
      psVar9 = psVar4;
      if (cVar13 == '\x02') goto LAB_0010d907;
      if (cVar13 != '\x03') {
        if (((uint)uVar14 & ~*(uint *)((long)&psVar4->field_14 + 0x18)) != 0) {
          psVar9 = dmrC_alloc_symbol(C->S,psVar4->pos,4);
          memcpy(psVar9,psVar4,0xe8);
          pcVar1 = &(psVar9->field_14).field_2.ctype;
          pcVar1->modifiers = pcVar1->modifiers | uVar14;
        }
        goto LAB_0010d8de;
      }
    }
    psVar4 = (symbol *)0x0;
    dmrC_expression_error(C,expr,"incompatible types in conditional expression (%s)");
    iVar2 = dmrC_expr_truth_value(C,(expr->field_5).field_3.unop);
    psVar9 = psVar5;
    if (iVar2 != 1) {
      if (iVar2 != 0) {
        return (symbol *)0x0;
      }
      psVar4 = (symbol *)0x0;
      psVar9 = psVar3;
    }
  }
  else {
    psVar9 = usual_conversions(C,0x3f,(paVar15->field_3).unop,(expr->field_5).field_10.cond_false,
                               lclass,rclass,psVar5,psVar3);
LAB_0010d8de:
    peVar6 = cast_to(C,(paVar15->field_3).unop,psVar9);
    (paVar15->field_3).unop = peVar6;
    peVar6 = cast_to(C,(expr->field_5).field_10.cond_false,psVar9);
    (expr->field_5).field_10.cond_false = peVar6;
    psVar4 = psVar9;
  }
LAB_0010d907:
  expr->ctype = psVar9;
  return psVar4;
}

Assistant:

static struct symbol *evaluate_conditional_expression(struct dmr_C *C, struct expression *expr)
{
	struct expression **truee;
	struct symbol *ctype, *ltype, *rtype, *lbase, *rbase;
	int lclass, rclass;
	const char * typediff;
	int qual;

	if (!evaluate_conditional(C, expr->conditional, 0))
		return NULL;
	if (!dmrC_evaluate_expression(C, expr->cond_false))
		return NULL;

	ctype = degenerate(C, expr->conditional);
	rtype = degenerate(C, expr->cond_false);

	truee = &expr->conditional;
	ltype = ctype;
	if (expr->cond_true) {
		if (!dmrC_evaluate_expression(C, expr->cond_true))
			return NULL;
		ltype = degenerate(C, expr->cond_true);
		truee = &expr->cond_true;
	}

	if (expr->flags) {
		int flags = expr->conditional->flags & Int_const_expr;
		flags &= (*truee)->flags & expr->cond_false->flags;
		if (!flags)
			expr->flags = 0;
	}

	lclass = classify_type(C, ltype, &ltype);
	rclass = classify_type(C, rtype, &rtype);
	if (lclass & rclass & TYPE_NUM) {
		ctype = usual_conversions(C, '?', *truee, expr->cond_false,
					  lclass, rclass, ltype, rtype);
		*truee = cast_to(C, *truee, ctype);
		expr->cond_false = cast_to(C, expr->cond_false, ctype);
		goto out;
	}

	if ((lclass | rclass) & TYPE_PTR) {
		int is_null1 = is_null_pointer_constant(C, *truee);
		int is_null2 = is_null_pointer_constant(C, expr->cond_false);

		if (is_null1 && is_null2) {
			*truee = cast_to(C, *truee, &C->S->ptr_ctype);
			expr->cond_false = cast_to(C, expr->cond_false, &C->S->ptr_ctype);
			ctype = &C->S->ptr_ctype;
			goto out;
		}
		if (is_null1 && (rclass & TYPE_PTR)) {
			if (is_null1 == 2)
				bad_null(C, *truee);
			*truee = cast_to(C, *truee, rtype);
			ctype = rtype;
			goto out;
		}
		if (is_null2 && (lclass & TYPE_PTR)) {
			if (is_null2 == 2)
				bad_null(C, expr->cond_false);
			expr->cond_false = cast_to(C, expr->cond_false, ltype);
			ctype = ltype;
			goto out;
		}
		if (!(lclass & rclass & TYPE_PTR)) {
			typediff = "different types";
			goto Err;
		}
		/* OK, it's pointer on pointer */
		if (ltype->ctype.as != rtype->ctype.as) {
			typediff = "different address spaces";
			goto Err;
		}

		/* need to be lazier here */
		lbase = dmrC_examine_pointer_target(C->S, ltype);
		rbase = dmrC_examine_pointer_target(C->S, rtype);
		qual = target_qualifiers(C, ltype) | target_qualifiers(C, rtype);

		if (lbase == &C->S->void_ctype) {
			/* XXX: pointers to function should warn here */
			ctype = ltype;
			goto Qual;

		}
		if (rbase == &C->S->void_ctype) {
			/* XXX: pointers to function should warn here */
			ctype = rtype;
			goto Qual;
		}
		/* XXX: that should be pointer to composite */
		ctype = ltype;
		typediff = dmrC_type_difference(C, &ltype->ctype, &rtype->ctype,
					   qual, qual);
		if (!typediff)
			goto Qual;
		goto Err;
	}

	/* void on void, struct on same struct, union on same union */
	if (ltype == rtype) {
		ctype = ltype;
		goto out;
	}
	typediff = "different base types";

Err:
	dmrC_expression_error(C, expr, "incompatible types in conditional expression (%s)", typediff);
	/*
	 * if the condition is constant, the type is in fact known
	 * so use it, as gcc & clang do.
	 */
	switch (dmrC_expr_truth_value(C, expr->conditional)) {
	case 1:	expr->ctype = ltype;
		break;
	case 0: expr->ctype = rtype;
		break;
	default:
		break;
	}
	return NULL;

out:
	expr->ctype = ctype;
	return ctype;

Qual:
	if (qual & ~ctype->ctype.modifiers) {
		struct symbol *sym = dmrC_alloc_symbol(C->S, ctype->pos, SYM_PTR);
		*sym = *ctype;
		sym->ctype.modifiers |= qual;
		ctype = sym;
	}
	*truee = cast_to(C, *truee, ctype);
	expr->cond_false = cast_to(C, expr->cond_false, ctype);
	goto out;
}